

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space_factory.h
# Opt level: O3

size_type __thiscall
projects::dpg::ProductUniformFESpaceFactory<double>::AddL2Component
          (ProductUniformFESpaceFactory<double> *this,size_type degree)

{
  size_type sVar1;
  _func_int **pp_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_48;
  _func_int **local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  ReferenceFiniteElement
            ((ProductUniformFESpaceFactory<double> *)&stack0xffffffffffffffc8,(RefEl)(RefElType)this
             ,3);
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  peVar3 = (element_type *)p_Stack_30;
  pp_Var2 = local_38;
  (local_48.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_48.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_48.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_003c5078;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_48.
             super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_38 = (_func_int **)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__DiscontinuousScalarReferenceFiniteElement_003c50c8;
  *(_func_int ***)
   &local_48.
    super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[1]._M_use_count = pp_Var2;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)peVar3;
  std::
  vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
  ::emplace_back<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
              *)&this->rfs_tria_v_,&local_48);
  if (local_48.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  ReferenceFiniteElement
            ((ProductUniformFESpaceFactory<double> *)&stack0xffffffffffffffc8,(RefEl)(RefElType)this
             ,4);
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var4 = p_Stack_30;
  pp_Var2 = local_38;
  (local_48.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_48.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_48.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_003c5078;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_48.
             super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_38 = (_func_int **)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__DiscontinuousScalarReferenceFiniteElement_003c50c8;
  *(_func_int ***)
   &local_48.
    super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[1]._M_use_count = pp_Var2;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  std::
  vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
  ::emplace_back<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
              *)&this->rfs_quad_v_,&local_48);
  if (local_48.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
  ::emplace_back<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
              *)&this->rfs_segment_v_,&local_48);
  if (local_48.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
  ::emplace_back<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((vector<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>,std::allocator<std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>>
              *)&this->rfs_point_v_,&local_48);
  if (local_48.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  sVar1 = this->num_components_;
  this->num_components_ = sVar1 + 1;
  return sVar1;
}

Assistant:

size_type ProductUniformFESpaceFactory<SCALAR>::AddL2Component(
    size_type degree) {
  // add discontinuous shape functions to triangles and quads.
  rfs_tria_v_.push_back(
      std::make_shared<DiscontinuousScalarReferenceFiniteElement<SCALAR>>(
          ReferenceFiniteElement(lf::base::RefEl::kTria(), degree)));
  rfs_quad_v_.push_back(
      std::make_shared<DiscontinuousScalarReferenceFiniteElement<SCALAR>>(
          ReferenceFiniteElement(lf::base::RefEl::kQuad(), degree)));
  rfs_segment_v_.push_back(nullptr);
  rfs_point_v_.push_back(nullptr);
  return num_components_++;
}